

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error doCdataSection(XML_Parser parser,ENCODING *enc,char **startPtr,char *end,char **nextPtr,
                        XML_Bool haveMore,XML_Account account)

{
  XML_Parsing XVar1;
  XML_CharacterDataHandler p_Var2;
  XML_DefaultHandler p_Var3;
  char *pcVar4;
  int iVar5;
  XML_Convert_Result XVar6;
  char **ppcVar7;
  undefined3 in_register_00000089;
  OPEN_INTERNAL_ENTITY *pOVar8;
  char *next;
  char *s;
  undefined4 local_54;
  char **local_50;
  ICHAR *dataPtr;
  char **local_40;
  char *local_38;
  
  local_54 = CONCAT31(in_register_00000089,haveMore);
  s = *startPtr;
  if (parser->m_encoding == enc) {
    pOVar8 = (OPEN_INTERNAL_ENTITY *)&parser->m_eventPtr;
    parser->m_eventPtr = s;
    ppcVar7 = &parser->m_eventEndPtr;
  }
  else {
    pOVar8 = parser->m_openInternalEntities;
    ppcVar7 = &pOVar8->internalEventEndPtr;
  }
  pOVar8->internalEventPtr = s;
  *startPtr = (char *)0x0;
  local_50 = nextPtr;
  local_40 = startPtr;
  do {
    next = s;
    iVar5 = (*enc->scanners[2])(enc,s,end,&next);
    *ppcVar7 = next;
    switch(iVar5) {
    case 0:
      pOVar8->internalEventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case 6:
      p_Var2 = parser->m_characterDataHandler;
      if (p_Var2 == (XML_CharacterDataHandler)0x0) {
        p_Var3 = parser->m_defaultHandler;
joined_r0x005a39d2:
        if (p_Var3 != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,s,next);
        }
      }
      else {
        pcVar4 = end;
        if (enc->isUtf8 == '\0') {
          while( true ) {
            local_38 = pcVar4;
            dataPtr = parser->m_dataBuf;
            XVar6 = (*enc->utf8Convert)(enc,&s,next,&dataPtr,parser->m_dataBufEnd);
            *ppcVar7 = next;
            (*p_Var2)(parser->m_handlerArg,parser->m_dataBuf,(int)dataPtr - (int)parser->m_dataBuf);
            end = local_38;
            if (XVar6 < XML_CONVERT_OUTPUT_EXHAUSTED) break;
            pOVar8->internalEventPtr = s;
            pcVar4 = local_38;
          }
        }
        else {
          (*p_Var2)(parser->m_handlerArg,s,(int)next - (int)s);
        }
      }
      break;
    case 7:
      if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        p_Var3 = parser->m_defaultHandler;
        goto joined_r0x005a39d2;
      }
      dataPtr = (ICHAR *)CONCAT71(dataPtr._1_7_,10);
      (*parser->m_characterDataHandler)(parser->m_handlerArg,(XML_Char *)&dataPtr,1);
      break;
    case -4:
    case -1:
      if ((char)local_54 == '\0') {
        return XML_ERROR_UNCLOSED_CDATA_SECTION;
      }
      goto LAB_005a3aaf;
    case -3:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      goto switchD_005a3972_caseD_fffffffd;
    case -2:
      if ((char)local_54 == '\0') {
        return XML_ERROR_PARTIAL_CHAR;
      }
LAB_005a3aaf:
      *local_50 = s;
      return XML_ERROR_NONE;
    default:
      if (iVar5 == 0x28) {
        if (parser->m_endCdataSectionHandler == (XML_EndCdataSectionHandler)0x0) {
          if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
            reportDefault(parser,enc,s,next);
          }
        }
        else {
          (*parser->m_endCdataSectionHandler)(parser->m_handlerArg);
        }
        *local_40 = next;
        *local_50 = next;
        if ((parser->m_parsingStatus).parsing != XML_FINISHED) {
          return XML_ERROR_NONE;
        }
        return XML_ERROR_ABORTED;
      }
      goto switchD_005a3972_caseD_fffffffd;
    }
    s = next;
    pOVar8->internalEventPtr = next;
    XVar1 = (parser->m_parsingStatus).parsing;
    if (XVar1 == XML_FINISHED) {
      return XML_ERROR_ABORTED;
    }
    if (XVar1 == XML_SUSPENDED) {
      *local_50 = next;
      return XML_ERROR_NONE;
    }
  } while( true );
switchD_005a3972_caseD_fffffffd:
  pOVar8->internalEventPtr = next;
  return XML_ERROR_UNEXPECTED_STATE;
}

Assistant:

static enum XML_Error
doCdataSection(XML_Parser parser, const ENCODING *enc, const char **startPtr,
               const char *end, const char **nextPtr, XML_Bool haveMore,
               enum XML_Account account) {
  const char *s = *startPtr;
  const char **eventPP;
  const char **eventEndPP;
  if (enc == parser->m_encoding) {
    eventPP = &parser->m_eventPtr;
    *eventPP = s;
    eventEndPP = &parser->m_eventEndPtr;
  } else {
    eventPP = &(parser->m_openInternalEntities->internalEventPtr);
    eventEndPP = &(parser->m_openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  *startPtr = NULL;

  for (;;) {
    const char *next = s; /* in case of XML_TOK_NONE or XML_TOK_PARTIAL */
    int tok = XmlCdataSectionTok(enc, s, end, &next);
#ifdef XML_DTD
    if (! accountingDiffTolerated(parser, tok, s, next, __LINE__, account)) {
      accountingOnAbort(parser);
      return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
    }
#else
    UNUSED_P(account);
#endif
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_CDATA_SECT_CLOSE:
      if (parser->m_endCdataSectionHandler)
        parser->m_endCdataSectionHandler(parser->m_handlerArg);
      /* BEGIN disabled code */
      /* see comment under XML_TOK_CDATA_SECT_OPEN */
      else if (0 && parser->m_characterDataHandler)
        parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                                       0);
      /* END disabled code */
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      *startPtr = next;
      *nextPtr = next;
      if (parser->m_parsingStatus.parsing == XML_FINISHED)
        return XML_ERROR_ABORTED;
      else
        return XML_ERROR_NONE;
    case XML_TOK_DATA_NEWLINE:
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      } else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_DATA_CHARS: {
      XML_CharacterDataHandler charDataHandler = parser->m_characterDataHandler;
      if (charDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          for (;;) {
            ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
            const enum XML_Convert_Result convert_res = XmlConvert(
                enc, &s, next, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
            *eventEndPP = next;
            charDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                            (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
            if ((convert_res == XML_CONVERT_COMPLETED)
                || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
              break;
            *eventPP = s;
          }
        } else
          charDataHandler(parser->m_handlerArg, (XML_Char *)s,
                          (int)((XML_Char *)next - (XML_Char *)s));
      } else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
    } break;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_PARTIAL:
    case XML_TOK_NONE:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_CDATA_SECTION;
    default:
      /* Every token returned by XmlCdataSectionTok() has its own
       * explicit case, so this default case will never be executed.
       * We retain it as a safety net and exclude it from the coverage
       * statistics.
       *
       * LCOV_EXCL_START
       */
      *eventPP = next;
      return XML_ERROR_UNEXPECTED_STATE;
      /* LCOV_EXCL_STOP */
    }

    *eventPP = s = next;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default:;
    }
  }
  /* not reached */
}